

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_result_collector.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalResultCollector::BuildPipelines
          (PhysicalResultCollector *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var1;
  PipelineBuildState *this_00;
  MetaPipeline *this_01;
  
  _Var1._M_head_impl =
       (this->super_PhysicalOperator).sink_state.
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var1._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  this_00 = MetaPipeline::GetState(meta_pipeline);
  PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
  this_01 = MetaPipeline::CreateChildMetaPipeline
                      (meta_pipeline,current,&this->super_PhysicalOperator,REGULAR);
  MetaPipeline::Build(this_01,this->plan);
  return;
}

Assistant:

void PhysicalResultCollector::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	// operator is a sink, build a pipeline
	sink_state.reset();

	D_ASSERT(children.empty());

	// single operator: the operator becomes the data source of the current pipeline
	auto &state = meta_pipeline.GetState();
	state.SetPipelineSource(current, *this);

	// we create a new pipeline starting from the child
	auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
	child_meta_pipeline.Build(plan);
}